

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validationinterface.cpp
# Opt level: O0

void __thiscall ValidationSignals::SyncWithValidationInterfaceQueue(ValidationSignals *this)

{
  function<void_()> *pfVar1;
  promise<void> *in_RDI;
  long in_FS_OFFSET;
  promise<void> promise;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  promise<void> *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  function<void_()> *in_stack_ffffffffffffff90;
  promise<void> *in_stack_ffffffffffffff98;
  __basic_future<void> local_58;
  function<void_()> *local_48;
  function<void_()> local_20;
  
  local_20._M_invoker = *(_Invoker_type *)(in_FS_OFFSET + 0x28);
  AssertLockNotHeldInline
            (in_stack_ffffffffffffff78,(char *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,
             (RecursiveMutex *)0x84de6a);
  pfVar1 = &local_20;
  std::promise<void>::promise(in_stack_ffffffffffffff98);
  local_48 = pfVar1;
  std::function<void()>::function<ValidationSignals::SyncWithValidationInterfaceQueue()::__0,void>
            (pfVar1,(anon_class_8_1_70ebebfb *)in_stack_ffffffffffffff70);
  CallFunctionInValidationInterfaceQueue
            ((ValidationSignals *)in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  std::function<void_()>::~function
            ((function<void_()> *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  pfVar1 = &local_20;
  std::promise<void>::get_future(in_stack_ffffffffffffff70);
  std::__basic_future<void>::wait(&local_58,pfVar1);
  std::future<void>::~future
            ((future<void> *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  std::promise<void>::~promise(in_RDI);
  if (*(_Invoker_type *)(in_FS_OFFSET + 0x28) == local_20._M_invoker) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ValidationSignals::SyncWithValidationInterfaceQueue()
{
    AssertLockNotHeld(cs_main);
    // Block until the validation queue drains
    std::promise<void> promise;
    CallFunctionInValidationInterfaceQueue([&promise] {
        promise.set_value();
    });
    promise.get_future().wait();
}